

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_write_encrypt_aes256_file_fuzzer.c
# Opt level: O2

int LLVMFuzzerTestOneInput(uint8_t *data,size_t size)

{
  uint in_EAX;
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  char *__format;
  undefined8 in_R8;
  undefined8 in_R9;
  FILE *pFVar6;
  ulong uStack_28;
  int error;
  
  uStack_28 = (ulong)in_EAX;
  remove("test_aes256.zip");
  lVar3 = zip_open("test_aes256.zip",1,&error);
  if (lVar3 == 0) {
    return -1;
  }
  lVar4 = zip_source_buffer(lVar3,data,size,0,in_R8,in_R9,uStack_28);
  pFVar6 = _stderr;
  if (lVar4 == 0) {
    uVar5 = zip_strerror(lVar3);
    __format = "failed to create source buffer. %s\n";
  }
  else {
    uVar1 = zip_file_add(lVar3,"filename",lVar4,0x2000);
    pFVar6 = _stderr;
    if ((int)uVar1 < 0) {
      uVar5 = zip_strerror(lVar3);
      fprintf(pFVar6,"failed to add file to archive: %s\n",uVar5);
      zip_source_free(lVar4);
      goto LAB_0010139c;
    }
    iVar2 = zip_file_set_encryption(lVar3,uVar1 & 0x7fffffff,0x103,"password");
    pFVar6 = _stderr;
    if (iVar2 < 0) {
      uVar5 = zip_strerror(lVar3);
      __format = "failed to set file encryption: %s\n";
    }
    else {
      iVar2 = zip_close(lVar3);
      pFVar6 = _stderr;
      if (-1 < iVar2) {
        remove("test_aes256.zip");
        return 0;
      }
      uVar5 = zip_strerror(lVar3);
      __format = "error closing archive: %s\n";
    }
  }
  fprintf(pFVar6,__format,uVar5);
LAB_0010139c:
  zip_discard(lVar3);
  return -1;
}

Assistant:

int
LLVMFuzzerTestOneInput(const uint8_t *data, size_t size) {
    const char *path = "test_aes256.zip";
    const char *password = "password";
    const char *file = "filename";
    int error = 0;
    struct zip *archive;

    (void)remove(path);
    if ((archive = zip_open(path, ZIP_CREATE, &error)) == NULL) {
        return -1;
    }

    struct zip_source *source = zip_source_buffer(archive, data, size, 0);
    if (source == NULL) {
        fprintf(stderr, "failed to create source buffer. %s\n", zip_strerror(archive));
        zip_discard(archive);
        return -1;
    }

    int index = (int)zip_file_add(archive, file, source, ZIP_FL_OVERWRITE);
    if (index < 0) {
        fprintf(stderr, "failed to add file to archive: %s\n", zip_strerror(archive));
        zip_source_free(source);
        zip_discard(archive);
        return -1;
    }
    if (zip_file_set_encryption(archive, index, ZIP_EM_AES_256, password) < 0) {
        fprintf(stderr, "failed to set file encryption: %s\n", zip_strerror(archive));
        zip_discard(archive);
        return -1;
    }
    if (zip_close(archive) < 0) {
        fprintf(stderr, "error closing archive: %s\n", zip_strerror(archive));
        zip_discard(archive);
        return -1;
    }
    (void)remove(path);

    return 0;
}